

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

size_t sum_dividers<short,std::vector<libdivide::divider<short,(libdivide::Branching)0>,std::allocator<libdivide::divider<short,(libdivide::Branching)0>>>>
                 (short numerator,
                 vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
                 *dividers)

{
  bool bVar1;
  ushort in_DI;
  divider<short,_(libdivide::Branching)0> *divider;
  const_iterator __end0;
  const_iterator __begin0;
  vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
  *__range1;
  size_t sum;
  int16_t q_1;
  int16_t sign_1;
  uint16_t uq_1;
  int16_t q;
  uint16_t uq;
  uint16_t mask;
  uint16_t sign;
  uint8_t shift;
  int32_t rl;
  int32_t yl;
  int32_t xl;
  vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
  *in_stack_ffffffffffffff70;
  __normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
  local_80 [2];
  size_t local_70;
  ushort local_5a;
  __normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
  *local_58;
  ushort local_4c;
  ushort local_4a;
  __normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
  *local_48;
  ushort local_3a;
  __normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
  *local_38;
  __normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
  *local_30;
  ushort local_28;
  short local_26;
  ushort local_24;
  short local_22;
  short local_20;
  short local_1e;
  ushort local_1c;
  ushort local_1a;
  byte local_18;
  byte local_17;
  short local_16;
  ushort local_14;
  short local_12;
  int local_10;
  int local_c;
  int local_8;
  short local_4;
  ushort local_2;
  
  local_70 = 0;
  local_5a = in_DI;
  local_80[0]._M_current =
       (divider<short,_(libdivide::Branching)0> *)
       std::
       vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
       ::begin(in_stack_ffffffffffffff68);
  std::
  vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
  ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    in_stack_ffffffffffffff70 =
         (__normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
          *)__gnu_cxx::
            __normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
            ::operator*(local_80);
    local_4c = local_5a;
    local_4a = local_5a;
    local_3a = local_5a;
    local_28 = local_5a;
    local_16 = (((dispatcher_t *)&in_stack_ffffffffffffff70->_M_current)->denom).magic;
    local_17 = (((dispatcher_t *)&in_stack_ffffffffffffff70->_M_current)->denom).more;
    local_14 = local_5a;
    local_18 = local_17 & 0x1f;
    if (local_16 == 0) {
      local_1a = (ushort)((int)(char)local_17 >> 7);
      local_1c = (short)(1 << local_18) - 1;
      local_1e = local_5a + ((short)local_5a >> 0xf & local_1c);
      local_20 = ((ushort)((int)local_1e >> local_18) ^ local_1a) - local_1a;
      local_12 = local_20;
    }
    else {
      local_2 = local_5a;
      local_8 = (int)(short)local_5a;
      local_c = (int)local_16;
      local_10 = local_8 * local_c;
      local_22 = (short)((uint)local_10 >> 0x10);
      if ((local_17 & 0x40) != 0) {
        local_24 = (ushort)((int)(char)local_17 >> 7);
        local_22 = local_22 + ((local_5a ^ local_24) - local_24);
      }
      local_26 = (short)((int)local_22 >> local_18);
      local_26 = local_26 + (ushort)(local_26 < 0);
      local_12 = local_26;
      local_4 = local_16;
    }
    local_70 = (long)local_12 + local_70;
    local_58 = in_stack_ffffffffffffff70;
    local_48 = in_stack_ffffffffffffff70;
    local_38 = in_stack_ffffffffffffff70;
    local_30 = in_stack_ffffffffffffff70;
    __gnu_cxx::
    __normal_iterator<const_libdivide::divider<short,_(libdivide::Branching)0>_*,_std::vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>_>
    ::operator++(local_80);
  }
  return local_70;
}

Assistant:

NOINLINE size_t sum_dividers(N numerator, const T& dividers) {
    size_t sum = 0;

    for (const auto& divider : dividers) sum += (size_t)(numerator / divider);

    return sum;
}